

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

float3 * ConvexDecomposition::operator-=(float3 *a,float3 *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar3;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar1 = b->x;
  uVar4 = b->y;
  auVar6._4_4_ = uVar4;
  auVar6._0_4_ = uVar1;
  auVar6._8_8_ = 0;
  uVar2 = a->x;
  uVar5 = a->y;
  auVar7._4_4_ = uVar5;
  auVar7._0_4_ = uVar2;
  auVar7._8_8_ = 0;
  auVar6 = vsubps_avx(auVar7,auVar6);
  uVar3 = vmovlps_avx(auVar6);
  a->x = (float)(int)uVar3;
  a->y = (float)(int)((ulong)uVar3 >> 0x20);
  a->z = a->z - b->z;
  return a;
}

Assistant:

float3& operator-=( float3& a , const float3& b )
{
		a.x -= b.x;
		a.y -= b.y;
		a.z -= b.z;
		return a;
}